

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O2

bool TestEthernetV2(int curLine,AmpIO *Board,BasePort *Port,ofstream *logFile)

{
  uint16_t uVar1;
  bool bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  ostream *poVar5;
  bool bVar6;
  uint16_t MacAddrIn;
  uint16_t MacAddrOutLow;
  ushort local_36;
  uint32_t status;
  
  poVar5 = std::endl<char,std::char_traits<char>>((ostream *)logFile);
  poVar5 = std::operator<<(poVar5,"=== Ethernet (KSZ8851) Test ===");
  std::endl<char,std::char_traits<char>>(poVar5);
  uVar4 = BoardIO::GetFirmwareVersion((BoardIO *)Board);
  if (uVar4 < 5) {
    poVar5 = std::operator<<((ostream *)logFile,"   No Ethernet controller, firmware version = ");
    BoardIO::GetFirmwareVersion((BoardIO *)Board);
  }
  else {
    FpgaIO::ReadEthernetStatus(&Board->super_FpgaIO,&status);
    if ((int)status < 0) {
      poVar5 = std::operator<<((ostream *)logFile,"   Ethernet controller status = ");
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
      FpgaIO::WriteEthernetPhyReset(&Board->super_FpgaIO,0);
      Amp1394_Sleep(0.1);
      FpgaIO::ReadEthernetStatus(&Board->super_FpgaIO,&status);
      poVar5 = std::operator<<((ostream *)logFile,"   After reset, status = ");
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::endl<char,std::char_traits<char>>(poVar5);
      uVar3 = FpgaIO::ReadKSZ8851ChipID(&Board->super_FpgaIO);
      poVar5 = std::operator<<((ostream *)logFile,"   Chip ID = ");
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar3);
      std::endl<char,std::char_traits<char>>(poVar5);
      if ((uVar3 & 0xfff0) != 0x8870) {
        return false;
      }
      MacAddrOutLow = 1;
      bVar6 = true;
      for (local_36 = 0x8000; (MacAddrOutLow != 0 && (local_36 != 0)); local_36 = local_36 >> 1) {
        poVar5 = std::operator<<((ostream *)logFile,"   MAC address: ");
        *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
             *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
        bVar2 = FpgaIO::WriteKSZ8851Reg(&Board->super_FpgaIO,'\x10',&MacAddrOutLow);
        if (bVar2) {
          poVar5 = std::operator<<((ostream *)logFile,"write low = ");
          std::ostream::operator<<(poVar5,MacAddrOutLow);
        }
        bVar2 = FpgaIO::WriteKSZ8851Reg(&Board->super_FpgaIO,'\x12',&local_36);
        if (bVar2) {
          poVar5 = std::operator<<((ostream *)logFile,", write mid = ");
          std::ostream::operator<<(poVar5,local_36);
        }
        MacAddrIn = 0;
        bVar2 = FpgaIO::ReadKSZ8851Reg(&Board->super_FpgaIO,'\x10',&MacAddrIn);
        if (bVar2) {
          poVar5 = std::operator<<((ostream *)logFile,", read low = ");
          std::ostream::operator<<(poVar5,MacAddrIn);
        }
        uVar1 = MacAddrOutLow;
        uVar3 = MacAddrIn;
        bVar2 = FpgaIO::ReadKSZ8851Reg(&Board->super_FpgaIO,'\x12',&MacAddrIn);
        if (bVar2) {
          poVar5 = std::operator<<((ostream *)logFile,", read mid = ");
          std::ostream::operator<<(poVar5,MacAddrIn);
        }
        if ((local_36 != MacAddrIn) || (uVar1 != uVar3)) {
          std::operator<<((ostream *)logFile," ***");
          bVar6 = false;
        }
        std::endl<char,std::char_traits<char>>((ostream *)logFile);
        MacAddrOutLow = MacAddrOutLow * 2;
      }
      FpgaIO::WriteEthernetPhyReset(&Board->super_FpgaIO,0);
      return bVar6;
    }
    poVar5 = std::operator<<((ostream *)logFile,"   No Ethernet controller, status = ");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
  }
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  return false;
}

Assistant:

bool TestEthernetV2(int curLine, AmpIO &Board, BasePort *Port, std::ofstream &logFile)
{
    logFile << std::endl << "=== Ethernet (KSZ8851) Test ===" << std::endl;
    if (Board.GetFirmwareVersion() < 5) {
        logFile << "   No Ethernet controller, firmware version = " << Board.GetFirmwareVersion() << std::endl;
        return false;
    }
    uint32_t status;
    Board.ReadEthernetStatus(status);
    if (!(status & FpgaIO::ETH_STAT_PRESENT_V2)) {
        logFile << "   No Ethernet controller, status = " << std::hex << (status>>16) << std::endl;
        return false;
    }
    logFile << "   Ethernet controller status = " << std::hex << (status>>16) << std::endl;
    // Reset the board
    Board.WriteEthernetPhyReset();
    // Wait 100 msec
    Amp1394_Sleep(0.1);
    // Read the status
    Board.ReadEthernetStatus(status);
    logFile << "   After reset, status = " << std::hex << (status>>16) << std::endl;
    // Read the Chip ID (16-bit read)
    uint16_t chipID = Board.ReadKSZ8851ChipID();
    logFile << "   Chip ID = " << std::hex << chipID << std::endl;
    if ((chipID&0xfff0) != 0x8870)
        return false;
#if 0
    // Read Chip ID using 8-bit read
    // TODO: Reading from 0xC0 works (get 0x72), but not from 0xC1 (get 0xC1 instead of 0x88)
    uint8_t chipIDHigh;
    Board.ReadKSZ8851Reg(0xC1, chipIDHigh);
    logFile << "   Chip ID high (8-bit read) = " << std::hex << static_cast<int>(chipIDHigh) << std::endl;
    if (chipIDHigh != 0x88)
        return false;
#endif
    // Walking bit pattern on MAC address registers (R/W)
    // 0x10 is MARL (MAC Address Register Low)
    // 0x12 is MARM (MAC Address Register Middle)
    uint16_t MacAddrOutLow, MacAddrOutMid, MacAddrIn;
    bool ret = true;
    for (MacAddrOutLow = 0x0001, MacAddrOutMid = 0x8000;
         (MacAddrOutLow != 0) && (MacAddrOutMid != 0);
         MacAddrOutLow <<= 1, MacAddrOutMid >>= 1) {
        logFile << "   MAC address: " << std::hex;
        if (Board.WriteKSZ8851Reg(0x10, MacAddrOutLow))
            logFile << "write low = " << MacAddrOutLow;
        if (Board.WriteKSZ8851Reg(0x12, MacAddrOutMid))
            logFile << ", write mid = " << MacAddrOutMid;
        MacAddrIn = 0;
        bool failed = false;
        if (Board.ReadKSZ8851Reg(0x10, MacAddrIn))
            logFile << ", read low = " << MacAddrIn;
        if (MacAddrOutLow != MacAddrIn) failed = true;
        if (Board.ReadKSZ8851Reg(0x12, MacAddrIn))
            logFile << ", read mid = " << MacAddrIn;
        if (MacAddrOutMid != MacAddrIn) failed = true;
        if (failed) {
            logFile << " ***";
            ret = false;
        }
        logFile << std::endl;
    }
    // Reset the board again (to restore MAC address)
    Board.WriteEthernetPhyReset();
    return ret;
}